

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqc.c
# Opt level: O0

void opj_mqc_codelps(opj_mqc_t *mqc)

{
  opj_mqc_t *mqc_local;
  
  mqc->a = mqc->a - (*mqc->curctx)->qeval;
  if (mqc->a < (*mqc->curctx)->qeval) {
    mqc->c = (*mqc->curctx)->qeval + mqc->c;
  }
  else {
    mqc->a = (*mqc->curctx)->qeval;
  }
  *mqc->curctx = (*mqc->curctx)->nlps;
  opj_mqc_renorme(mqc);
  return;
}

Assistant:

static void opj_mqc_codelps(opj_mqc_t *mqc)
{
    mqc->a -= (*mqc->curctx)->qeval;
    if (mqc->a < (*mqc->curctx)->qeval) {
        mqc->c += (*mqc->curctx)->qeval;
    } else {
        mqc->a = (*mqc->curctx)->qeval;
    }
    *mqc->curctx = (*mqc->curctx)->nlps;
    opj_mqc_renorme(mqc);
}